

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunked_sequence.hpp
# Opt level: O0

iterator_base<true>
pstore::chunked_sequence<int,2ul,4ul,4ul>::
end_impl<pstore::chunked_sequence<int,2ul,4ul,4ul>const,pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<true>>
          (chunked_sequence<int,_2UL,_4UL,_4UL> *cv)

{
  size_type sVar1;
  const_iterator it;
  iterator_base<true> iVar2;
  chunked_sequence<int,_2UL,_4UL,_4UL> *cv_local;
  size_t local_10;
  
  sVar1 = std::__cxx11::
          list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
          ::size(&cv->chunks_);
  if (sVar1 != 0) {
    sVar1 = chunked_sequence<int,_2UL,_4UL,_4UL>::size(cv);
    if (sVar1 == 0) {
      _cv_local = chunked_sequence<int,_2UL,_4UL,_4UL>::begin(cv);
    }
    else {
      it = std::__cxx11::
           list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
           ::end(&cv->chunks_);
      chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::iterator_base
                ((iterator_base<true> *)&cv_local,(list_iterator)it._M_node,0);
    }
    iVar2.chunk_it_._M_node = (_List_node_base *)cv_local;
    iVar2.index_ = local_10;
    return iVar2;
  }
  assert_failed("cv.chunks_.size () > 0U",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/chunked_sequence.hpp"
                ,0x13f);
}

Assistant:

Result chunked_sequence<T, ElementsPerChunk, ActualSize, ActualAlign>::end_impl (
        ChunkedSequence & cv) noexcept {
        // We always have at least 1 chunk. If the container is empty then return the begin iterator
        // otherwise an iterator referencing end and of the last member of the last chunk.
        PSTORE_ASSERT (cv.chunks_.size () > 0U);
        if (cv.size () > 0U) {
            return {cv.chunks_.end (), 0U};
        }
        return cv.begin ();
    }